

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::CordFieldGenerator::
GenerateMemberConstexprConstructor(CordFieldGenerator *this,Printer *p)

{
  bool bVar1;
  allocator<char> local_f1;
  char *local_f0;
  string local_e8;
  Sub local_c8;
  
  if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ !=
      (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Split",&local_f1);
    bVar1 = ShouldSplit((this->super_FieldGeneratorBase).field_,
                        (this->super_FieldGeneratorBase).options_);
    local_f0 = anon_var_dwarf_651463 + 5;
    if (bVar1) {
      local_f0 = "Split::";
    }
    io::Printer::Sub::Sub<char_const*>(&local_c8,&local_e8,&local_f0);
    io::Printer::Emit(p,&local_c8,1,0x69,
                      "$name$_{::absl::strings_internal::MakeStringConstant($classname$::Impl_::$Split$_default_$name$_func_{})}"
                     );
    io::Printer::Sub::~Sub(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    return;
  }
  io::Printer::Emit(p,9,"$name$_{}");
  return;
}

Assistant:

void GenerateMemberConstexprConstructor(io::Printer* p) const override {
    if (field_->default_value_string().empty()) {
      p->Emit("$name$_{}");
    } else {
      p->Emit({{"Split", ShouldSplit(field_, options_) ? "Split::" : ""}},
              "$name$_{::absl::strings_internal::MakeStringConstant("
              "$classname$::Impl_::$Split$_default_$name$_func_{})}");
    }
  }